

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O3

bool OutputBin(FILE *file,char *buf,uint startIndex,uint stopIndex)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  size_t __n;
  ulong uVar4;
  char hexNumber [3];
  uint convertedByte;
  char outBuf [256];
  char local_147;
  char local_146;
  undefined1 local_145;
  undefined4 local_144;
  FILE *local_140;
  undefined1 local_138 [264];
  
  local_145 = 0;
  if (startIndex < stopIndex) {
    uVar4 = 0;
    uVar3 = startIndex;
    local_140 = (FILE *)file;
    do {
      local_147 = buf[uVar4 * 2 + (long)(int)startIndex];
      local_146 = buf[uVar4 * 2 + (long)(int)startIndex + 1];
      local_144 = 0;
      iVar1 = __isoc99_sscanf(&local_147,"%x",&local_144);
      if (iVar1 != 1) {
        return false;
      }
      local_138[uVar4 & 0xffffffff] = (undefined1)local_144;
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 + 2;
    } while (uVar3 < stopIndex);
    __n = uVar4 & 0xffffffff;
    file = (FILE *)local_140;
  }
  else {
    __n = 0;
  }
  sVar2 = fwrite(local_138,1,__n,(FILE *)file);
  return sVar2 == __n;
}

Assistant:

static bool OutputBin(FILE* file, const char * buf,
                      unsigned int startIndex, unsigned int stopIndex)
{
  bool success = true;
  char hexNumber[3];
  hexNumber[2] = '\0';
  char outBuf[256];
  unsigned int outBufCount = 0;
  for (unsigned int i = startIndex; i < stopIndex; i += 2)
    {
    hexNumber[0] = buf[i];
    hexNumber[1] = buf[i+1];
    unsigned int convertedByte = 0;
    if (sscanf(hexNumber, "%x", &convertedByte) != 1)
      {
      success = false;
      break;
      }
    outBuf[outBufCount] = static_cast<char>(convertedByte & 0xff);
    outBufCount++;
    }
  if (success)
    {
    success = (fwrite(outBuf, 1, outBufCount, file)==outBufCount);
    }
  return success;
}